

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyFileReader.cpp
# Opt level: O0

bool __thiscall
KeyFileReader<NWN::ResRef16>::ReadEncapsulatedFile
          (KeyFileReader<NWN::ResRef16> *this,FileHandle File,size_t Offset,size_t BytesToRead,
          size_t *BytesRead,void *Buffer)

{
  byte bVar1;
  int iVar2;
  PCKEY_RESOURCE_DESCRIPTOR p_Var3;
  undefined4 extraout_var;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 *in_R8;
  undefined8 in_R9;
  bool Status;
  FileHandle FileHandle;
  PCKEY_RESOURCE_DESCRIPTOR ResKey;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  KeyFileReader<NWN::ResRef16> *in_stack_ffffffffffffffb8;
  bool local_1;
  long lVar4;
  
  p_Var3 = LookupResourceKey(in_stack_ffffffffffffffb8,
                             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  *in_R8 = 0;
  if (p_Var3 == (PCKEY_RESOURCE_DESCRIPTOR)0x0) {
    local_1 = false;
  }
  else {
    iVar2 = (*(p_Var3->BifFile->super_IResourceAccessor<NWN::ResRef16>)._vptr_IResourceAccessor[1])
                      (p_Var3->BifFile,(ulong)((p_Var3->Res).ResID & 0xfffff));
    lVar4 = CONCAT44(extraout_var,iVar2);
    if (lVar4 == 0) {
      local_1 = false;
    }
    else {
      iVar2 = (*(p_Var3->BifFile->super_IResourceAccessor<NWN::ResRef16>)._vptr_IResourceAccessor[3]
              )(p_Var3->BifFile,lVar4,in_RDX,in_RCX,in_R8,in_R9);
      bVar1 = (byte)iVar2 & 1;
      (*(p_Var3->BifFile->super_IResourceAccessor<NWN::ResRef16>)._vptr_IResourceAccessor[2])
                (p_Var3->BifFile,lVar4);
      local_1 = (bool)(bVar1 & 1);
    }
  }
  return local_1;
}

Assistant:

bool
KeyFileReader< ResRefT >::ReadEncapsulatedFile(
	 FileHandle File,
	 size_t Offset,
	 size_t BytesToRead,
	 size_t * BytesRead,
	 void * Buffer
	)
/*++

Routine Description:

	This routine logically reads an encapsulated sub-file within a BIF file
	that is attached to the KEY file.

	File reading is optimized for sequential scan.

Arguments:

	File - Supplies a file handle to the desired sub-file to read.

	Offset - Supplies the offset into the desired sub-file to read from.

	BytesToRead - Supplies the requested count of bytes to read.

	BytesRead - Receives the count of bytes transferred.

	Buffer - Supplies the address of a buffer to transfer raw encapsulated file
	         contents to.

Return Value:

	The routine returns a Boolean value indicating true on success, else false
	on failure.  An attempt to read from an invalid file handle, or an attempt
	to read beyond the end of file would be examples of failure conditions.

Environment:

	User mode.

--*/
{
	PCKEY_RESOURCE_DESCRIPTOR  ResKey;
	typename BifFileReaderT::FileHandle FileHandle;
	bool                       Status;

	//
	// First, locate the BIF file to read.
	//

	ResKey = LookupResourceKey( ((ResID) File) - 1 );

	*BytesRead = 0;

	if (ResKey == NULL)
		return false;

	//
	// Now delegate the read request to the specific BIF file that has been
	// chosen.
	//
	// N.B.  File open/close for BIF files is a no-op, so we avoid implementing
	//       an extra handle table indirection level here (as it would only
	//       slow things down).  The file open and close calls are essentially
	//       no-ops.
	//

	FileHandle = ResKey->BifFile->OpenFileByIndex(
		ResKey->Res.ResID & 0xFFFFF );

	if (FileHandle == INVALID_FILE)
		return false;

	Status = ResKey->BifFile->ReadEncapsulatedFile(
		FileHandle,
		Offset,
		BytesToRead,
		BytesRead,
		Buffer);

	ResKey->BifFile->CloseFile( FileHandle );
	FileHandle = INVALID_FILE;

	return Status;
}